

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O0

void __thiscall Architecture::Architecture(Architecture *this)

{
  int iVar1;
  Database *this_00;
  PrintLanguageCapability *pPVar2;
  undefined4 extraout_var;
  OptionDatabase *this_01;
  Architecture *this_local;
  
  AddrSpaceManager::AddrSpaceManager(&this->super_AddrSpaceManager);
  (this->super_AddrSpaceManager)._vptr_AddrSpaceManager = (_func_int **)&PTR__Architecture_00849298;
  std::__cxx11::string::string((string *)&this->archid);
  std::vector<Rule_*,_std::allocator<Rule_*>_>::vector(&this->extra_pool_rules);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ProtoModel_*>_>_>
  ::map(&this->protoModels);
  RangeList::RangeList(&this->nohighptr);
  std::vector<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>::vector(&this->printlist);
  std::vector<TypeOp_*,_std::allocator<TypeOp_*>_>::vector(&this->inst);
  UserOpManage::UserOpManage(&this->userops);
  std::vector<PreferSplitRecord,_std::allocator<PreferSplitRecord>_>::vector(&this->splitrecords);
  ActionDatabase::ActionDatabase(&this->allacts);
  this->trim_recurse_max = 5;
  this->max_implied_ref = 2;
  this->max_term_duplication = 2;
  this->max_basetype_size = 10;
  this->min_funcsymbol_size = 1;
  this->aggressive_ext_trim = false;
  this->readonlypropagate = false;
  this->infer_pointers = true;
  this->pointer_lowerbound = 0x1000;
  this->funcptr_align = 0;
  this->flowoptions = 0;
  this->defaultfp = (ProtoModel *)0x0;
  (this->defaultReturnAddr).space = (AddrSpace *)0x0;
  this->evalfp_current = (ProtoModel *)0x0;
  this->evalfp_called = (ProtoModel *)0x0;
  this->types = (TypeFactory *)0x0;
  this->translate = (Translate *)0x0;
  this->loader = (LoadImage *)0x0;
  this->pcodeinjectlib = (PcodeInjectLibrary *)0x0;
  this->commentdb = (CommentDatabase *)0x0;
  this->cpool = (ConstantPool *)0x0;
  this_00 = (Database *)operator_new(0x90);
  Database::Database(this_00,this);
  this->symboltab = this_00;
  this->context = (ContextDatabase *)0x0;
  pPVar2 = PrintLanguageCapability::getDefault();
  iVar1 = (*(pPVar2->super_CapabilityPoint)._vptr_CapabilityPoint[3])(pPVar2,this);
  this->print = (PrintLanguage *)CONCAT44(extraout_var,iVar1);
  std::vector<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>::push_back
            (&this->printlist,&this->print);
  this_01 = (OptionDatabase *)operator_new(0x38);
  OptionDatabase::OptionDatabase(this_01,this);
  this->options = this_01;
  this->loadersymbols_parsed = false;
  return;
}

Assistant:

Architecture::Architecture(void)

{
  //  endian = -1;
  trim_recurse_max = 5;		// Reasonable default value
  max_implied_ref = 2;		// 2 is best, in specific cases a higher number might be good
  max_term_duplication = 2;	// 2 and 3 (4) are pretty reasonable
  max_basetype_size = 10;	// Needs to be 8 or bigger
  min_funcsymbol_size = 1;
  aggressive_ext_trim = false;
  readonlypropagate = false;
  infer_pointers = true;
  pointer_lowerbound = 0x1000;
  funcptr_align = 0;
  flowoptions = 0;
  defaultfp = (ProtoModel *)0;
  defaultReturnAddr.space = (AddrSpace *)0;
  evalfp_current = (ProtoModel *)0;
  evalfp_called = (ProtoModel *)0;
  types = (TypeFactory *)0;
  translate = (Translate *)0;
  loader = (LoadImage *)0;
  pcodeinjectlib = (PcodeInjectLibrary *)0;
  commentdb = (CommentDatabase *)0;
  cpool = (ConstantPool *)0;
  symboltab = new Database(this);
  context = (ContextDatabase *)0;
  print = PrintLanguageCapability::getDefault()->buildLanguage(this);
  printlist.push_back(print);
  options = new OptionDatabase(this);
  loadersymbols_parsed = false;
#ifdef CPUI_STATISTICS
  stats = new Statistics();
#endif
#ifdef OPACTION_DEBUG
  debugstream = (ostream *)0;
#endif
}